

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O1

void coda_url_preunescape(char *s,char *dest,size_t sz)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  char xnum_1 [3];
  char xnum [3];
  char local_3e;
  char local_3d;
  undefined1 local_3c;
  char local_3b;
  char local_3a;
  undefined1 local_39;
  size_t local_38;
  
  cVar5 = *s;
  if (sz == 0xfffffffffffffffb || cVar5 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    local_38 = sz;
    do {
      if (cVar5 == '\\') {
        if ((s[1] == 'x') && (iVar2 = isxdigit((int)s[2]), iVar2 != 0)) {
          cVar1 = s[3];
          iVar2 = isxdigit((int)cVar1);
          if (iVar2 != 0) {
            local_3e = s[2];
            local_3c = 0;
            local_3d = cVar1;
            lVar3 = strtol(&local_3e,(char **)0x0,0x10);
            if ((char)lVar3 < '\0') {
              dest[uVar4] = (char)lVar3;
              uVar4 = uVar4 + 1;
            }
            else if (uVar4 + 3 < local_38) {
              *(undefined4 *)(dest + uVar4) = *(undefined4 *)s;
            }
            s = s + 4;
            goto LAB_001041a0;
          }
        }
LAB_00104196:
        dest[uVar4] = cVar5;
        uVar4 = uVar4 + 1;
        s = s + 1;
      }
      else {
        if (((cVar5 != '%') || (iVar2 = isxdigit((int)s[1]), iVar2 == 0)) ||
           (iVar2 = isxdigit((int)s[2]), iVar2 == 0)) goto LAB_00104196;
        local_3b = s[1];
        local_3a = s[2];
        local_39 = 0;
        lVar3 = strtol(&local_3b,(char **)0x0,0x10);
        if ((char)lVar3 < '\0') {
          dest[uVar4] = (char)lVar3;
          lVar3 = 1;
        }
        else {
          lVar3 = 3;
          if (uVar4 + 4 < local_38) {
            dest[uVar4 + 2] = s[2];
            *(undefined2 *)(dest + uVar4) = *(undefined2 *)s;
          }
        }
        uVar4 = uVar4 + lVar3;
        s = s + 3;
      }
LAB_001041a0:
      cVar5 = *s;
    } while ((cVar5 != '\0') && (uVar4 < sz + 5));
  }
  dest[uVar4] = '\0';
  return;
}

Assistant:

void coda_url_preunescape(const char* s, char* dest, size_t sz)
{
	size_t ptr = 0;
	while (*s && (ptr < sz + 5))
	{
		if ((*s == '%') && isxdigit(s[1]) && isxdigit(s[2]))
		{
			char xnum[3];
			xnum[0] = s[1];
			xnum[1] = s[2];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 4 < sz) memcpy(dest + ptr, s, 3);
				ptr += 3;
			}
			s += 3;
		}
		else if ((*s == '\\') && (s[1] == 'x') && isxdigit(s[2]) && isxdigit(s[3]))
		{
			char xnum[3];
			xnum[0] = s[2];
			xnum[1] = s[3];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 3 < sz) memcpy(dest + ptr, s, 4);
			}
			s += 4;
		}
		else
		{
			dest[ptr] = *s;
			ptr++;
			s++;
		}
	}
	dest[ptr] = 0;
}